

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_scalar_rst(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  double local_190;
  int local_188;
  int local_180;
  int local_17c;
  int local_178;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  undefined4 local_d0;
  int doubles;
  int dim;
  int version;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char magic [9];
  int length;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  undefined4 local_a0;
  REF_STATUS ref_private_macro_code_rss;
  int dof;
  int steps;
  int step;
  int variables;
  FILE *file;
  int local_80;
  REF_STATUS status;
  REF_INT im;
  REF_INT i;
  REF_INT n;
  REF_INT local;
  REF_GLOB first;
  REF_GLOB nnode_written;
  REF_GLOB global;
  REF_DBL *xyzm;
  REF_DBL *local_xyzm;
  REF_MPI pRStack_40;
  REF_INT chunk;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  char *filename_local;
  REF_DBL *scalar_local;
  REF_GRID pRStack_18;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  ref_mpi = (REF_MPI)ref_grid->node;
  pRStack_40 = ref_grid->mpi;
  ref_node = (REF_NODE)filename;
  filename_local = (char *)scalar;
  scalar_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  uVar4 = ref_node_synchronize_globals((REF_NODE)ref_mpi);
  if (uVar4 == 0) {
    ref_private_macro_code_rss = 2;
    steps = scalar_local._4_4_ / 2;
    register0x00000000 = (long)(steps * 2);
    if (scalar_local._4_4_ == register0x00000000) {
      uVar1 = ref_mpi[1].timing;
      _step = (FILE *)0x0;
      local_a0 = uVar1;
      if (pRStack_18->mpi->id == 0) {
        magic[1] = '\b';
        magic[2] = '\0';
        magic[3] = '\0';
        magic[4] = '\0';
        dim._3_1_ = 'C';
        version._0_1_ = 'O';
        version._1_1_ = 'F';
        version._2_1_ = 'F';
        version._3_1_ = 'E';
        cStack_c0 = 'R';
        cStack_bf = 'S';
        cStack_be = 'T';
        magic[0] = '\0';
        doubles = 2;
        ref_private_status_reis_ai_1._4_4_ = 0;
        _step = fopen((char *)ref_node,"w");
        if (_step == (FILE *)0x0) {
          printf("unable to open %s\n",ref_node);
        }
        if (_step == (FILE *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x61d,"ref_gather_scalar_rst","unable to open file");
          return 2;
        }
        sVar5 = fwrite(magic + 1,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x61f,"ref_gather_scalar_rst","length",1,sVar5);
          return 1;
        }
        sVar5 = (size_t)(int)magic._1_4_;
        sVar6 = fwrite((void *)((long)&dim + 3),1,(long)(int)magic._1_4_,_step);
        if (sVar5 != sVar6) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x621,"ref_gather_scalar_rst","magic",sVar5,sVar6);
          return 1;
        }
        sVar5 = fwrite(&doubles,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x622,"ref_gather_scalar_rst","version",1,sVar5);
          return 1;
        }
        local_d0 = 3;
        if (pRStack_18->twod != 0) {
          local_d0 = 2;
        }
        sVar5 = fwrite(&local_d0,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x625,"ref_gather_scalar_rst","dim",1,sVar5);
          return 1;
        }
        sVar5 = fwrite(&steps,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x626,"ref_gather_scalar_rst","variables",1,sVar5);
          return 1;
        }
        sVar5 = fwrite(&ref_private_macro_code_rss,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x627,"ref_gather_scalar_rst","steps",1,sVar5);
          return 1;
        }
        sVar5 = fwrite(&local_a0,4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x628,"ref_gather_scalar_rst","dof",1,sVar5);
          return 1;
        }
        sVar5 = fwrite((void *)((long)&ref_private_status_reis_ai_1 + 4),4,1,_step);
        if (sVar5 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x629,"ref_gather_scalar_rst","doubles",1,sVar5);
          return 1;
        }
      }
      local_17c = (int)(*(long *)&ref_mpi[1].timing / (long)pRStack_40->n) + 1;
      if (pRStack_40->reduce_byte_limit < 1) {
        local_178 = 0x7fffffff;
      }
      else {
        local_178 = pRStack_40->reduce_byte_limit / ((steps + 1) * 8);
      }
      if (local_178 <= local_17c) {
        if (pRStack_40->reduce_byte_limit < 1) {
          local_180 = 0x7fffffff;
        }
        else {
          local_180 = pRStack_40->reduce_byte_limit / ((steps + 1) * 8);
        }
        local_17c = local_180;
      }
      local_xyzm._4_4_ = local_17c;
      if ((steps + 1) * local_17c < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x631,"ref_gather_scalar_rst","malloc local_xyzm of REF_DBL negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        xyzm = (REF_DBL *)malloc((long)((steps + 1) * local_17c) << 3);
        if (xyzm == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x631,"ref_gather_scalar_rst","malloc local_xyzm of REF_DBL NULL");
          ref_grid_local._4_4_ = 2;
        }
        else if ((steps + 1) * local_xyzm._4_4_ < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x632,"ref_gather_scalar_rst","malloc xyzm of REF_DBL negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          global = (REF_GLOB)malloc((long)((steps + 1) * local_xyzm._4_4_) << 3);
          if ((void *)global == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x632,"ref_gather_scalar_rst","malloc xyzm of REF_DBL NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            for (dof = 0; dof < ref_private_macro_code_rss; dof = dof + 1) {
              first = 0;
              while (lVar3._0_4_ = ref_mpi[1].timing, lVar3._4_4_ = ref_mpi[1].reduce_byte_limit,
                    first < lVar3) {
                _n = first;
                if ((long)local_xyzm._4_4_ < *(long *)&ref_mpi[1].timing - first) {
                  local_188 = local_xyzm._4_4_;
                }
                else {
                  uVar2 = ref_mpi[1].timing;
                  local_188 = uVar2 - (int)first;
                }
                im = local_188;
                first = local_188 + first;
                for (status = 0; status < (steps + 1) * local_xyzm._4_4_; status = status + 1) {
                  xyzm[status] = 0.0;
                }
                for (status = 0; status < im; status = status + 1) {
                  nnode_written = _n + status;
                  uVar4 = ref_node_local((REF_NODE)ref_mpi,nnode_written,&i);
                  file._4_4_ = uVar4;
                  if ((uVar4 != 0) && (uVar4 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x642,"ref_gather_scalar_rst",(ulong)uVar4,"node local failed");
                    return uVar4;
                  }
                  if ((uVar4 == 0) &&
                     (pRStack_40->id == *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)i * 4))
                     ) {
                    for (local_80 = 0; local_80 < steps; local_80 = local_80 + 1) {
                      xyzm[local_80 + (steps + 1) * status] =
                           *(REF_DBL *)
                            (filename_local + (long)(local_80 + scalar_local._4_4_ * i) * 8);
                    }
                    xyzm[steps + (steps + 1) * status] = 1.0;
                  }
                  else {
                    for (local_80 = 0; local_80 < steps + 1; local_80 = local_80 + 1) {
                      xyzm[local_80 + (steps + 1) * status] = 0.0;
                    }
                  }
                }
                uVar4 = ref_mpi_sum(pRStack_40,xyzm,(void *)global,(steps + 1) * im,3);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x650,"ref_gather_scalar_rst",(ulong)uVar4,"sum");
                  return uVar4;
                }
                if (pRStack_40->id == 0) {
                  for (status = 0; status < im; status = status + 1) {
                    if (*(double *)(global + (long)(steps + (steps + 1) * status) * 8) - 1.0 <= 0.0)
                    {
                      local_190 = -(*(double *)(global + (long)(steps + (steps + 1) * status) * 8) -
                                   1.0);
                    }
                    else {
                      local_190 = *(double *)(global + (long)(steps + (steps + 1) * status) * 8) -
                                  1.0;
                    }
                    if (0.1 < local_190) {
                      printf("error gather node %ld %f\n",
                             *(undefined8 *)(global + (long)(steps + (steps + 1) * status) * 8),
                             _n + status);
                    }
                    for (local_80 = 0; local_80 < steps; local_80 = local_80 + 1) {
                      sVar5 = fwrite((void *)(global + (long)(local_80 + (steps + 1) * status) * 8),
                                     8,1,_step);
                      if (sVar5 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x65c,"ref_gather_scalar_rst","s",1,sVar5);
                        return 1;
                      }
                    }
                  }
                }
              }
            }
            if (global != 0) {
              free((void *)global);
            }
            if (xyzm != (REF_DBL *)0x0) {
              free(xyzm);
            }
            if (pRStack_18->mpi->id == 0) {
              fclose(_step);
            }
            ref_grid_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x610,"ref_gather_scalar_rst","ldim not divisble by steps",(long)scalar_local._4_4_,
             register0x00000000);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x60d,
           "ref_gather_scalar_rst",(ulong)uVar4,"sync");
    ref_grid_local._4_4_ = uVar4;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_rst(REF_GRID ref_grid, REF_INT ldim,
                                                REF_DBL *scalar,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  FILE *file;
  int variables, step, steps, dof;

  RSS(ref_node_synchronize_globals(ref_node), "sync");
  steps = 2;
  variables = ldim / steps;
  REIS(ldim, variables * steps, "ldim not divisble by steps");
  dof = (int)ref_node_n_global(ref_node);

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    int length = 8;
    char magic[] = "COFFERST";
    int version = 2;
    int dim;
    int doubles = 0;

    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    REIS(1, fwrite(&length, sizeof(length), 1, file), "length");
    REIS(length, fwrite(magic, sizeof(char), (unsigned long)length, file),
         "magic");
    REIS(1, fwrite(&version, sizeof(version), 1, file), "version");
    dim = 3;
    if (ref_grid_twod(ref_grid)) dim = 2;
    REIS(1, fwrite(&dim, sizeof(dim), 1, file), "dim");
    REIS(1, fwrite(&variables, sizeof(variables), 1, file), "variables");
    REIS(1, fwrite(&steps, sizeof(steps), 1, file), "steps");
    REIS(1, fwrite(&dof, sizeof(dof), 1, file), "dof");
    REIS(1, fwrite(&doubles, sizeof(doubles), 1, file), "doubles");
    /* assume zero doubles, skip misc metadata (timestep) */
  }

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, (variables + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (variables + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (variables + 1) * chunk, REF_DBL);

  for (step = 0; step < steps; step++) {
    nnode_written = 0;
    while (nnode_written < ref_node_n_global(ref_node)) {
      first = nnode_written;
      n = (REF_INT)MIN((REF_GLOB)chunk,
                       ref_node_n_global(ref_node) - nnode_written);

      nnode_written += n;

      for (i = 0; i < (variables + 1) * chunk; i++) local_xyzm[i] = 0.0;

      for (i = 0; i < n; i++) {
        global = first + i;
        status = ref_node_local(ref_node, global, &local);
        RXS(status, REF_NOT_FOUND, "node local failed");
        if (REF_SUCCESS == status &&
            ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
          for (im = 0; im < variables; im++)
            local_xyzm[im + (variables + 1) * i] = scalar[im + ldim * local];
          local_xyzm[variables + (variables + 1) * i] = 1.0;
        } else {
          for (im = 0; im < (variables + 1); im++)
            local_xyzm[im + (variables + 1) * i] = 0.0;
        }
      }

      RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (variables + 1) * n,
                      REF_DBL_TYPE),
          "sum");

      if (ref_mpi_once(ref_mpi))
        for (i = 0; i < n; i++) {
          if (ABS(xyzm[variables + (variables + 1) * i] - 1.0) > 0.1) {
            printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                   xyzm[variables + (variables + 1) * i]);
          }
          for (im = 0; im < variables; im++) {
            REIS(1,
                 fwrite(&(xyzm[im + (variables + 1) * i]), sizeof(REF_DBL), 1,
                        file),
                 "s");
          }
        }
    }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}